

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_axi.c
# Opt level: O1

REF_STATUS ref_axi_wedge(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL pRVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  REF_STATUS RVar6;
  void *__ptr;
  long lVar7;
  undefined8 uVar8;
  REF_GLOB global;
  long lVar9;
  char *pcVar10;
  long lVar11;
  REF_INT RVar12;
  int cell;
  long lVar13;
  double dVar14;
  REF_INT nunique;
  REF_INT new_nodes [8];
  REF_INT pri_nodes [8];
  REF_INT new_cell;
  REF_INT pyr_nodes [8];
  REF_INT nodes [8];
  REF_INT unique [8];
  uint local_100;
  int local_fc;
  uint local_f8 [8];
  uint local_d8;
  undefined8 local_d4;
  uint local_cc;
  undefined8 local_c8;
  REF_GRID local_b8;
  REF_INT local_ac;
  undefined8 local_a8;
  uint local_a0;
  undefined8 local_9c;
  REF_INT local_88 [10];
  long local_60;
  REF_INT local_58 [10];
  
  ref_node = ref_grid->node;
  local_b8 = ref_grid;
  if ((long)ref_node->n < 0) {
    local_100 = 1;
    pcVar10 = "malloc o2n of REF_INT negative";
  }
  else {
    __ptr = malloc((long)ref_node->n << 2);
    if (__ptr != (void *)0x0) {
      bVar3 = true;
      if (0 < ref_node->n) {
        lVar7 = 0;
        do {
          *(undefined4 *)((long)__ptr + lVar7 * 4) = 0xffffffff;
          lVar7 = lVar7 + 1;
        } while (lVar7 < ref_node->n);
      }
      goto LAB_0012d528;
    }
    local_100 = 2;
    pcVar10 = "malloc o2n of REF_INT NULL";
  }
  bVar3 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",0x31,
         "ref_axi_wedge",pcVar10);
  __ptr = (void *)0x0;
LAB_0012d528:
  if (bVar3) {
    if (0 < ref_node->max) {
      local_60 = ref_node->old_n_global / 2;
      lVar7 = 0x10;
      lVar11 = 0;
      lVar13 = 0;
      do {
        lVar9 = ref_node->global[lVar13];
        if (-1 < lVar9) {
          dVar14 = *(double *)((long)ref_node->real + lVar7);
          if (dVar14 <= -dVar14) {
            dVar14 = -dVar14;
          }
          RVar12 = (REF_INT)lVar13;
          if (1e-06 <= dVar14) {
LAB_0012d687:
            *(REF_INT *)((long)__ptr + lVar13 * 4) = RVar12;
          }
          else {
            dVar14 = *(double *)((long)ref_node->real + lVar7 + -8);
            if (dVar14 <= -dVar14) {
              dVar14 = -dVar14;
            }
            if (dVar14 <= 0.5) goto LAB_0012d687;
            global = lVar9 - local_60;
            if (lVar9 < local_60) {
              puts("not expecting less than half, unless unit test");
              lVar9 = -1;
              if ((lVar13 < ref_node->max) && (lVar9 = ref_node->global[lVar13], lVar9 < 0)) {
                lVar9 = -1;
              }
              global = lVar9 + local_60;
            }
            uVar5 = ref_node_local(ref_node,global,(REF_INT *)((long)__ptr + lVar11));
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0x42,"ref_axi_wedge",(ulong)uVar5,"localize");
              return uVar5;
            }
            if (ref_node->ref_mpi->id == ref_node->part[lVar13]) {
              uVar5 = ref_node_remove(ref_node,RVar12);
              if (uVar5 != 0) {
                uVar8 = 0x45;
LAB_0012d6b1:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,uVar8,"ref_axi_wedge",(ulong)uVar5,"remove");
                local_100 = uVar5;
              }
            }
            else {
              uVar5 = ref_node_remove_without_global(ref_node,RVar12);
              if (uVar5 != 0) {
                uVar8 = 0x47;
                goto LAB_0012d6b1;
              }
            }
            if (uVar5 != 0) {
              return local_100;
            }
          }
          if ((lVar13 < ref_node->max) && (-1 < ref_node->global[lVar13])) {
            pRVar1 = ref_node->real;
            dVar14 = *(double *)((long)pRVar1 + lVar7 + -8);
            if (dVar14 <= -dVar14) {
              dVar14 = -dVar14;
            }
            if (0.5 < dVar14) {
              *(double *)((long)pRVar1 + lVar7 + -8) =
                   *(double *)((long)pRVar1 + lVar7) * 0.017452406437283494;
              *(double *)((long)pRVar1 + lVar7) =
                   *(double *)((long)pRVar1 + lVar7) * 0.9998476951563913;
            }
          }
        }
        lVar13 = lVar13 + 1;
        lVar11 = lVar11 + 4;
        lVar7 = lVar7 + 0x78;
      } while (lVar13 < ref_node->max);
    }
    uVar5 = ref_node_synchronize_globals(ref_node);
    if (uVar5 == 0) {
      pRVar2 = local_b8->cell[3];
      if (0 < pRVar2->max) {
        RVar12 = 0;
        do {
          RVar6 = ref_cell_nodes(pRVar2,RVar12,local_88);
          if (RVar6 == 0) {
            lVar7 = 0;
            do {
              local_f8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            local_f8[3] = local_88[3];
            uVar5 = ref_cell_replace_whole(pRVar2,RVar12,(REF_INT *)local_f8);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0x5b,"ref_axi_wedge",(ulong)uVar5,"renum");
              return uVar5;
            }
          }
          RVar12 = RVar12 + 1;
        } while (RVar12 < pRVar2->max);
      }
      pRVar2 = local_b8->cell[6];
      if (0 < pRVar2->max) {
        RVar12 = 0;
        do {
          RVar6 = ref_cell_nodes(pRVar2,RVar12,local_88);
          if (RVar6 == 0) {
            lVar7 = 0;
            do {
              local_f8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_f8[4] = local_88[4];
            uVar5 = ref_sort_unique_int(4,(REF_INT *)local_f8,&local_fc,local_58);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,99,"ref_axi_wedge",(ulong)uVar5,"uniq");
              return uVar5;
            }
            if ((local_fc < 4) && (uVar5 = ref_cell_remove(pRVar2,RVar12), uVar5 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,100,"ref_axi_wedge",(ulong)uVar5,"rm qua");
              return uVar5;
            }
            if (local_fc == 3) {
              if (local_f8[2] == local_f8[3]) {
                local_f8[3] = local_f8[4];
              }
              if (local_f8[1] == local_f8[2]) {
                local_f8[2] = local_f8[3];
                local_f8[3] = local_f8[4];
              }
              if (local_f8[0] == local_f8[1]) {
                local_f8[1] = local_f8[2];
                local_f8[2] = local_f8[3];
                local_f8[3] = local_f8[4];
              }
              if (local_f8[3] == local_f8[0]) {
                local_f8[0] = local_f8[1];
                local_f8[1] = local_f8[2];
                local_f8[2] = local_f8[3];
                local_f8[3] = local_f8[4];
              }
              uVar5 = ref_cell_add(local_b8->cell[3],(REF_INT *)local_f8,&local_ac);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0x79,"ref_axi_wedge",(ulong)uVar5,"new cell");
                return uVar5;
              }
            }
            if (local_fc == 4) {
              lVar7 = 0;
              do {
                local_f8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              local_f8[4] = local_88[4];
              uVar5 = ref_cell_replace_whole(pRVar2,RVar12,(REF_INT *)local_f8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0x7e,"ref_axi_wedge",(ulong)uVar5,"renum");
                return uVar5;
              }
            }
          }
          RVar12 = RVar12 + 1;
        } while (RVar12 < pRVar2->max);
      }
      pRVar2 = local_b8->cell[10];
      if (0 < pRVar2->max) {
        RVar12 = 0;
        do {
          RVar6 = ref_cell_nodes(pRVar2,RVar12,local_88);
          if (RVar6 == 0) {
            lVar7 = 0;
            do {
              local_f8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 6);
            uVar5 = ref_sort_unique_int(6,(REF_INT *)local_f8,&local_fc,local_58);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0x86,"ref_axi_wedge",(ulong)uVar5,"uniq");
              return uVar5;
            }
            if ((local_fc < 6) && (uVar5 = ref_cell_remove(pRVar2,RVar12), uVar5 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0x87,"ref_axi_wedge",(ulong)uVar5,"rm qua");
              return uVar5;
            }
            if (local_fc == 5) {
              if (local_f8[0] == local_f8[3]) {
                local_a8 = CONCAT44(local_f8[2],local_f8[1]);
                local_9c = CONCAT44(local_f8[5],local_f8[4]);
                local_a0 = local_f8[0];
              }
              if (local_f8[1] == local_f8[4]) {
                local_a8 = CONCAT44(local_f8[0],local_f8[2]);
                local_a0 = local_f8[1];
                local_9c = CONCAT44(local_f8[3],local_f8[5]);
              }
              if (local_f8[2] == local_f8[5]) {
                local_a8 = CONCAT44(local_f8[1],local_f8[0]);
                local_a0 = local_f8[2];
                local_9c = CONCAT44(local_f8[4],local_f8[3]);
              }
              uVar5 = ref_cell_add(local_b8->cell[9],(REF_INT *)&local_a8,&local_ac);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0x9f,"ref_axi_wedge",(ulong)uVar5,"new cell");
                return uVar5;
              }
            }
            if (local_fc == 4) {
              if (local_f8[1] != local_f8[4]) {
                local_f8[3] = local_f8[4];
              }
              if (local_f8[2] != local_f8[5]) {
                local_f8[3] = local_f8[5];
              }
              uVar5 = ref_cell_add(local_b8->cell[8],(REF_INT *)local_f8,&local_ac);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0xa5,"ref_axi_wedge",(ulong)uVar5,"new cell");
                return uVar5;
              }
            }
          }
          RVar12 = RVar12 + 1;
        } while (RVar12 < pRVar2->max);
      }
      pRVar2 = local_b8->cell[0xb];
      if (0 < pRVar2->max) {
        cell = 0;
        do {
          RVar6 = ref_cell_nodes(pRVar2,cell,local_88);
          if (RVar6 == 0) {
            lVar7 = 0;
            do {
              local_f8[lVar7] = *(uint *)((long)__ptr + (long)local_88[lVar7] * 4);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 8);
            uVar5 = ref_sort_unique_int(8,(REF_INT *)local_f8,&local_fc,local_58);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0xad,"ref_axi_wedge",(ulong)uVar5,"uniq");
              return uVar5;
            }
            if (local_fc != 8) {
              if ((local_fc < 8) && (uVar5 = ref_cell_remove(pRVar2,cell), uVar5 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0xaf,"ref_axi_wedge",(ulong)uVar5,"rm qua");
                return uVar5;
              }
              iVar4 = local_fc;
              if ((long)local_fc != 6) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                       ,0xb0,"ref_axi_wedge","expected 6 unique hex nodes on pole",6,(long)local_fc)
                ;
                local_100 = 1;
              }
              if (iVar4 != 6) {
                return local_100;
              }
              if (local_fc == 6) {
                local_d8 = 0xffffffff;
                if ((local_f8[0] == local_f8[1]) && (local_f8[4] == local_f8[5])) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[3],local_f8[2]);
                  local_c8 = CONCAT44(local_f8[7],local_f8[6]);
                  local_cc = local_f8[4];
                }
                if ((local_f8[0] == local_f8[4]) && (local_f8[1] == local_f8[5])) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[7],local_f8[3]);
                  local_cc = local_f8[1];
                  local_c8 = CONCAT44(local_f8[6],local_f8[2]);
                }
                if ((local_f8[1] == local_f8[2]) && (local_f8[5] == local_f8[6])) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[3],local_f8[1]);
                  local_cc = local_f8[4];
                  local_c8 = CONCAT44(local_f8[7],local_f8[5]);
                }
                if ((local_f8[1] == local_f8[5]) && (local_f8[2] == local_f8[6])) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[1],local_f8[4]);
                  local_cc = local_f8[0];
                  local_c8 = CONCAT44(local_f8[2],local_f8[7]);
                }
                if ((local_f8[3] == local_f8[7]) && (local_f8[2] == local_f8[6])) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[4],local_f8[3]);
                  local_cc = local_f8[1];
                  local_c8 = CONCAT44(local_f8[5],local_f8[2]);
                }
                if ((local_f8[3] == local_f8[2]) && (local_f8[7] == local_f8[6])) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[2],local_f8[1]);
                  local_cc = local_f8[4];
                  local_c8 = CONCAT44(local_f8[6],local_f8[5]);
                }
                if (local_f8[0] == local_f8[4] && local_f8[3] == local_f8[7]) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[1],local_f8[5]);
                  local_cc = local_f8[3];
                  local_c8 = CONCAT44(local_f8[1],local_f8[6]);
                }
                if (local_f8[4] == local_f8[7] && (local_f8[0] ^ local_f8[3]) == 0) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[2],local_f8[1]);
                  local_cc = local_f8[4];
                  local_c8 = CONCAT44(local_f8[6],local_f8[5]);
                }
                if (local_f8[0] == local_f8[1] && local_f8[3] == local_f8[2]) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[5],local_f8[4]);
                  local_cc = local_f8[3];
                  local_c8 = CONCAT44(local_f8[6],local_f8[7]);
                }
                if (local_f8[1] == local_f8[2] && (local_f8[0] ^ local_f8[3]) == 0) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[4],local_f8[7]);
                  local_cc = local_f8[1];
                  local_c8 = CONCAT44(local_f8[5],local_f8[6]);
                }
                if ((local_f8[4] == local_f8[5]) && (local_f8[7] == local_f8[6])) {
                  local_d8 = local_f8[0];
                  local_d4 = CONCAT44(local_f8[1],local_f8[4]);
                  local_cc = local_f8[0];
                  local_c8 = CONCAT44(local_f8[2],local_f8[7]);
                }
                if ((local_f8[4] == local_f8[7]) && (local_f8[5] == local_f8[6])) {
                  local_d8 = local_f8[1];
                  local_d4 = CONCAT44(local_f8[2],local_f8[5]);
                  local_cc = local_f8[0];
                  local_c8 = CONCAT44(local_f8[3],local_f8[4]);
                }
                uVar5 = ref_cell_add(local_b8->cell[10],(REF_INT *)&local_d8,&local_ac);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                         ,0x126,"ref_axi_wedge",(ulong)uVar5,"new cell");
                  return uVar5;
                }
              }
            }
          }
          cell = cell + 1;
        } while (cell < pRVar2->max);
      }
      local_100 = 0;
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",0x54,
             "ref_axi_wedge",(ulong)uVar5,"sync");
      local_100 = uVar5;
    }
  }
  return local_100;
}

Assistant:

REF_FCN REF_STATUS ref_axi_wedge(REF_GRID ref_grid) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL pole_tol;
  REF_INT *o2n, node;
  REF_GLOB nhalf, global;

  REF_INT cell, nodes[8], new_nodes[8], pyr_nodes[8], pri_nodes[8];
  REF_INT nunique, unique[8];
  REF_INT new_cell;

  REF_DBL radius, wedge_angle;

  ref_node = ref_grid_node(ref_grid);

  ref_malloc_init(o2n, ref_node_n(ref_node), REF_INT, REF_EMPTY);

  pole_tol = 1.0e-6; /* drop to smaller number */
  wedge_angle = ref_math_in_radians(1.0);

  /* make half logic globals, RCB can scrambles local indexes */
  nhalf = ref_node_n_global(ref_node) / 2;
  each_ref_node_valid_node(ref_node, node) {
    if (ABS(ref_node_xyz(ref_node, 2, node)) < pole_tol &&
        ABS(ref_node_xyz(ref_node, 1, node)) > 0.5) {
      if (ref_node_global(ref_node, node) < nhalf) {
        printf("not expecting less than half, unless unit test\n");
        global = ref_node_global(ref_node, node) + nhalf;
      } else {
        /* set to pair on plane that is kept */
        global = ref_node_global(ref_node, node) - nhalf;
      }
      RSS(ref_node_local(ref_node, global, &(o2n[node])), "localize");
      /* remove if you own it, remove without global if you don't own it */
      if (ref_node_owned(ref_node, node)) {
        RSS(ref_node_remove(ref_node, node), "remove");
      } else {
        RSS(ref_node_remove_without_global(ref_node, node), "remove");
      }
    } else {
      o2n[node] = node;
    }
    if (ref_node_valid(ref_node, node) && /* ignore collapsed nodes */
        ABS(ref_node_xyz(ref_node, 1, node)) > 0.5) {
      radius = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 1, node) = radius * sin(wedge_angle);
      ref_node_xyz(ref_node, 2, node) = radius * cos(wedge_angle);
    }
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 3; node++) new_nodes[node] = o2n[nodes[node]];
    new_nodes[3] = nodes[3];
    RSS(ref_cell_replace_whole(ref_cell, cell, new_nodes), "renum");
  }

  ref_cell = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 4; node++) new_nodes[node] = o2n[nodes[node]];
    new_nodes[4] = nodes[4];
    RSS(ref_sort_unique_int(4, new_nodes, &nunique, unique), "uniq");
    if (4 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    if (3 == nunique) {
      if (new_nodes[2] == new_nodes[3]) {
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[1] == new_nodes[2]) {
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[0] == new_nodes[1]) {
        new_nodes[1] = new_nodes[2];
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[3] == new_nodes[0]) {
        new_nodes[0] = new_nodes[1];
        new_nodes[1] = new_nodes[2];
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell),
          "new cell");
    }
    if (4 == nunique) {
      for (node = 0; node < 4; node++) new_nodes[node] = o2n[nodes[node]];
      new_nodes[4] = nodes[4];
      RSS(ref_cell_replace_whole(ref_cell, cell, new_nodes), "renum");
    }
  }

  ref_cell = ref_grid_pri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 6; node++) new_nodes[node] = o2n[nodes[node]];
    RSS(ref_sort_unique_int(6, new_nodes, &nunique, unique), "uniq");
    if (6 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    if (5 == nunique) {
      if (new_nodes[0] == new_nodes[3]) {
        pyr_nodes[0] = new_nodes[1];
        pyr_nodes[1] = new_nodes[2];
        pyr_nodes[2] = new_nodes[0];
        pyr_nodes[3] = new_nodes[4];
        pyr_nodes[4] = new_nodes[5];
      }
      if (new_nodes[1] == new_nodes[4]) {
        pyr_nodes[0] = new_nodes[2];
        pyr_nodes[1] = new_nodes[0];
        pyr_nodes[2] = new_nodes[1];
        pyr_nodes[3] = new_nodes[5];
        pyr_nodes[4] = new_nodes[3];
      }
      if (new_nodes[2] == new_nodes[5]) {
        pyr_nodes[0] = new_nodes[0];
        pyr_nodes[1] = new_nodes[1];
        pyr_nodes[2] = new_nodes[2];
        pyr_nodes[3] = new_nodes[3];
        pyr_nodes[4] = new_nodes[4];
      }
      RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_cell),
          "new cell");
    }
    if (4 == nunique) {
      if (new_nodes[1] != new_nodes[4]) new_nodes[3] = new_nodes[4];
      if (new_nodes[2] != new_nodes[5]) new_nodes[3] = new_nodes[5];
      RSS(ref_cell_add(ref_grid_tet(ref_grid), new_nodes, &new_cell),
          "new cell");
    }
  }

  ref_cell = ref_grid_hex(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 8; node++) new_nodes[node] = o2n[nodes[node]];
    RSS(ref_sort_unique_int(8, new_nodes, &nunique, unique), "uniq");
    if (8 == nunique) continue;
    if (8 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    REIS(6, nunique, "expected 6 unique hex nodes on pole");
    if (6 == nunique) {
      pri_nodes[0] = REF_EMPTY;

      /* 0: 0 4 5 1 */
      if (new_nodes[0] == new_nodes[1] && new_nodes[4] == new_nodes[5]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[2];
        pri_nodes[2] = new_nodes[3];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[7];
      }
      if (new_nodes[0] == new_nodes[4] && new_nodes[1] == new_nodes[5]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[3];
        pri_nodes[2] = new_nodes[7];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[2];
        pri_nodes[5] = new_nodes[6];
      }

      /* 1: 1 5 6 2 */
      if (new_nodes[1] == new_nodes[2] && new_nodes[5] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[3];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[7];
      }
      if (new_nodes[1] == new_nodes[5] && new_nodes[2] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[2];
      }

      /* 2: 2 6 7 3 */
      if (new_nodes[3] == new_nodes[7] && new_nodes[2] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[3];
        pri_nodes[2] = new_nodes[4];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[2];
        pri_nodes[5] = new_nodes[5];
      }
      if (new_nodes[3] == new_nodes[2] && new_nodes[7] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[6];
      }

      /* 3: 0 3 7 4 */
      if (new_nodes[0] == new_nodes[4] && new_nodes[3] == new_nodes[7]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[5];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[3];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[1];
      }
      if (new_nodes[0] == new_nodes[3] && new_nodes[4] == new_nodes[7]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[6];
      }

      /* 4: 0 1 2 3 */
      if (new_nodes[0] == new_nodes[1] && new_nodes[3] == new_nodes[2]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[5];
        pri_nodes[3] = new_nodes[3];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[6];
      }
      if (new_nodes[0] == new_nodes[3] && new_nodes[1] == new_nodes[2]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[7];
        pri_nodes[2] = new_nodes[4];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[5];
      }

      /* 5: 4 7 6 5 */
      if (new_nodes[4] == new_nodes[5] && new_nodes[7] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[2];
      }
      if (new_nodes[4] == new_nodes[7] && new_nodes[5] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[1];
        pri_nodes[1] = new_nodes[5];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[4];
        pri_nodes[5] = new_nodes[3];
      }

      /*
      printf(" new %d %d %d %d    %d %d %d %d\n", new_nodes[0], new_nodes[1],
             new_nodes[2], new_nodes[3], new_nodes[4], new_nodes[5],
             new_nodes[6], new_nodes[7]);
             */
      RSS(ref_cell_add(ref_grid_pri(ref_grid), pri_nodes, &new_cell),
          "new cell");
    }
  }

  ref_free(o2n);

  return REF_SUCCESS;
}